

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void col_txfm_16x16_rounding(__m128i *in,int shift)

{
  col_txfm_8x8_rounding(in,shift);
  col_txfm_8x8_rounding(in + 0x10,shift);
  col_txfm_8x8_rounding(in + 0x20,shift);
  col_txfm_8x8_rounding(in + 0x30,shift);
  return;
}

Assistant:

static void col_txfm_16x16_rounding(__m128i *in, int shift) {
  // Note:
  //  We split 16x16 rounding into 4 sections of 8x8 rounding,
  //  instead of 4 columns
  col_txfm_8x8_rounding(&in[0], shift);
  col_txfm_8x8_rounding(&in[16], shift);
  col_txfm_8x8_rounding(&in[32], shift);
  col_txfm_8x8_rounding(&in[48], shift);
}